

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000009bebc0 = 0x2e2e2e2e2e2e2e;
    uRam00000000009bebc7._0_1_ = '.';
    uRam00000000009bebc7._1_1_ = '.';
    uRam00000000009bebc7._2_1_ = '.';
    uRam00000000009bebc7._3_1_ = '.';
    uRam00000000009bebc7._4_1_ = '.';
    uRam00000000009bebc7._5_1_ = '.';
    uRam00000000009bebc7._6_1_ = '.';
    uRam00000000009bebc7._7_1_ = '.';
    DAT_009bebb0 = '.';
    DAT_009bebb0_1._0_1_ = '.';
    DAT_009bebb0_1._1_1_ = '.';
    DAT_009bebb0_1._2_1_ = '.';
    DAT_009bebb0_1._3_1_ = '.';
    DAT_009bebb0_1._4_1_ = '.';
    DAT_009bebb0_1._5_1_ = '.';
    DAT_009bebb0_1._6_1_ = '.';
    uRam00000000009bebb8 = 0x2e2e2e2e2e2e2e;
    DAT_009bebbf = 0x2e;
    DAT_009beba0 = '.';
    DAT_009beba0_1._0_1_ = '.';
    DAT_009beba0_1._1_1_ = '.';
    DAT_009beba0_1._2_1_ = '.';
    DAT_009beba0_1._3_1_ = '.';
    DAT_009beba0_1._4_1_ = '.';
    DAT_009beba0_1._5_1_ = '.';
    DAT_009beba0_1._6_1_ = '.';
    uRam00000000009beba8._0_1_ = '.';
    uRam00000000009beba8._1_1_ = '.';
    uRam00000000009beba8._2_1_ = '.';
    uRam00000000009beba8._3_1_ = '.';
    uRam00000000009beba8._4_1_ = '.';
    uRam00000000009beba8._5_1_ = '.';
    uRam00000000009beba8._6_1_ = '.';
    uRam00000000009beba8._7_1_ = '.';
    DAT_009beb90 = '.';
    DAT_009beb90_1._0_1_ = '.';
    DAT_009beb90_1._1_1_ = '.';
    DAT_009beb90_1._2_1_ = '.';
    DAT_009beb90_1._3_1_ = '.';
    DAT_009beb90_1._4_1_ = '.';
    DAT_009beb90_1._5_1_ = '.';
    DAT_009beb90_1._6_1_ = '.';
    uRam00000000009beb98._0_1_ = '.';
    uRam00000000009beb98._1_1_ = '.';
    uRam00000000009beb98._2_1_ = '.';
    uRam00000000009beb98._3_1_ = '.';
    uRam00000000009beb98._4_1_ = '.';
    uRam00000000009beb98._5_1_ = '.';
    uRam00000000009beb98._6_1_ = '.';
    uRam00000000009beb98._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000009beb88._0_1_ = '.';
    uRam00000000009beb88._1_1_ = '.';
    uRam00000000009beb88._2_1_ = '.';
    uRam00000000009beb88._3_1_ = '.';
    uRam00000000009beb88._4_1_ = '.';
    uRam00000000009beb88._5_1_ = '.';
    uRam00000000009beb88._6_1_ = '.';
    uRam00000000009beb88._7_1_ = '.';
    DAT_009bebcf = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}